

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_get_line.c
# Opt level: O1

char * Curl_get_line(char *buf,int len,FILE *input)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  
  pcVar1 = fgets(buf,len,(FILE *)input);
  if (pcVar1 == (char *)0x0) {
    lVar3 = 3;
  }
  else {
    sVar2 = strlen(pcVar1);
    lVar3 = 0;
    if ((sVar2 != 0) && (pcVar1[sVar2 - 1] == '\n')) {
      lVar3 = 1;
    }
  }
  pcVar1 = (char *)(*(code *)((long)&DAT_007b97ec + (long)(int)(&DAT_007b97ec)[lVar3]))();
  return pcVar1;
}

Assistant:

char *Curl_get_line(char *buf, int len, FILE *input)
{
  bool partial = FALSE;
  while(1) {
    char *b = fgets(buf, len, input);
    if(b) {
      size_t rlen = strlen(b);
      if(rlen && (b[rlen-1] == '\n')) {
        if(partial) {
          partial = FALSE;
          continue;
        }
        return b;
      }
      /* read a partial, discard the next piece that ends with newline */
      partial = TRUE;
    }
    else
      break;
  }
  return NULL;
}